

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O3

void __thiscall avro::json::JsonGenerator::sep(JsonGenerator *this)

{
  uint8_t *puVar1;
  
  if (this->top == stArray0) {
    this->top = stArrayN;
  }
  else if (this->top == stArrayN) {
    puVar1 = (this->out_).next_;
    if (puVar1 == (this->out_).end_) {
      StreamWriter::more(&this->out_);
      puVar1 = (this->out_).next_;
    }
    (this->out_).next_ = puVar1 + 1;
    *puVar1 = ',';
  }
  return;
}

Assistant:

void sep() {
        if (top == stArrayN) {
            out_.write(',');
        } else if (top == stArray0) {
            top = stArrayN;
        }
    }